

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O3

void __thiscall LinearScan::AddOpHelperSpilled(LinearScan *this,Lifetime *lifetime)

{
  RegNum RVar1;
  LoweredBasicBlock *pLVar2;
  code *pcVar3;
  bool bVar4;
  ushort uVar5;
  undefined4 *puVar6;
  ulong uVar7;
  
  RVar1 = lifetime->reg;
  if (this->currentOpHelperBlock == (OpHelperBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x2c7,"(this->IsInHelperBlock())","this->IsInHelperBlock()");
    if (!bVar4) goto LAB_00581b7a;
    *puVar6 = 0;
  }
  BVUnitT<unsigned_long>::AssertRange((uint)RVar1);
  uVar7 = 1L << (RVar1 & (RegXMM15|RegXMM14));
  if (((this->opHelperSpilledRegs).word >> ((ulong)RVar1 & 0x3f) & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x2c8,"(!this->opHelperSpilledRegs.Test(reg))",
                       "!this->opHelperSpilledRegs.Test(reg)");
    if (!bVar4) goto LAB_00581b7a;
    *puVar6 = 0;
  }
  uVar5 = *(ushort *)&lifetime->field_0x9c;
  if ((uVar5 & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x2c9,"(lifetime->isOpHelperSpilled == false)",
                       "lifetime->isOpHelperSpilled == false");
    if (!bVar4) goto LAB_00581b7a;
    *puVar6 = 0;
    uVar5 = *(ushort *)&lifetime->field_0x9c;
  }
  if ((uVar5 & 0x40) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x2ca,"(lifetime->cantOpHelperSpill == false)",
                       "lifetime->cantOpHelperSpill == false");
    if (!bVar4) {
LAB_00581b7a:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  BVUnitT<unsigned_long>::AssertRange((uint)RVar1);
  (this->opHelperSpilledRegs).word = (this->opHelperSpilledRegs).word | uVar7;
  lifetime->field_0x9c = lifetime->field_0x9c | 0x10;
  this->regContent[RVar1] = (Lifetime *)0x0;
  BVUnitT<unsigned_long>::AssertRange((uint)RVar1);
  (this->secondChanceRegs).word = (this->secondChanceRegs).word & ~uVar7;
  pLVar2 = this->currentBlock;
  if (0 < (pLVar2->inlineeFrameSyms).count - (pLVar2->inlineeFrameSyms).freeCount) {
    bVar4 = JsUtil::
            BaseDictionary<unsigned_int,_unsigned_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::ContainsKey(&pLVar2->inlineeFrameSyms,&(lifetime->sym->super_Sym).m_id);
    if ((bVar4) &&
       (((lifetime->sym->field_0x18 & 1) != 0 ||
        ((SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)
         (lifetime->defList).super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.
         super_SListNodeBase<Memory::ArenaAllocator>.next != &lifetime->defList)))) {
      lifetime->field_0x9c = lifetime->field_0x9c | 0x20;
      if ((lifetime->sym->field_0x19 & 0x10) == 0) {
        AllocateStackSpace(this,lifetime);
      }
      RecordLoopUse(this,lifetime,lifetime->reg);
    }
  }
  AddLiveRange(this->opHelperSpilledLiveranges,lifetime);
  return;
}

Assistant:

void
LinearScan::AddOpHelperSpilled(Lifetime * lifetime)
{
    RegNum reg = lifetime->reg;
    Assert(this->IsInHelperBlock());
    Assert(!this->opHelperSpilledRegs.Test(reg));
    Assert(lifetime->isOpHelperSpilled == false);
    Assert(lifetime->cantOpHelperSpill == false);


    this->opHelperSpilledRegs.Set(reg);
    lifetime->isOpHelperSpilled = true;

    this->regContent[reg] = nullptr;
    this->secondChanceRegs.Clear(reg);

    // If a lifetime is being OpHelper spilled and it's an inlinee arg sym
    // we need to make sure its spilled to the sym offset spill space, i.e. isOpHelperSpillAsArg
    // is set. Otherwise, it's value will not be available on inline frame reconstruction.
    if (this->currentBlock->inlineeFrameSyms.Count() > 0 &&
        this->currentBlock->inlineeFrameSyms.ContainsKey(lifetime->sym->m_id) &&
        (lifetime->sym->m_isSingleDef || !lifetime->defList.Empty()))
    {
        lifetime->isOpHelperSpillAsArg = true;
        if (!lifetime->sym->IsAllocated())
        {
            this->AllocateStackSpace(lifetime);
        }
        this->RecordLoopUse(lifetime, lifetime->reg);
    }
    LinearScan::AddLiveRange(this->opHelperSpilledLiveranges, lifetime);
}